

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_bool,_basic_string<char>_>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_bool,_basic_string<char>_>_> *p_Var4;
  char *pcVar5;
  char *__service;
  undefined8 uVar6;
  thread local_1f0;
  thread send_gui;
  thread send_game;
  thread recv_gui;
  thread recv_game;
  int result;
  int off;
  int *sock;
  addrinfo *p;
  addrinfo *paStack_1b0;
  int error;
  addrinfo *res;
  addrinfo hints;
  __cxx11 local_170 [8];
  string port;
  server_connection *server;
  server_connection *__end1;
  server_connection *__begin1;
  server_connection (*__range1) [2];
  string local_128 [32];
  undefined1 local_108 [8];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  server_address_1;
  string local_b8 [32];
  undefined1 local_98 [8];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  server_address;
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  session_id = time((time_t *)0x0);
  if ((int)argv_local < 3) {
    printf(anon_var_dwarf_750b);
    exit(1);
  }
  sVar2 = strlen(local_18[1]);
  if (0x40 < sVar2) {
    util::fatal("Given player name (%s) is longer than 64 chars\n",local_18[1]);
  }
  pcVar5 = local_18[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar5,&local_39);
  std::__cxx11::string::operator=((string *)player_name_abi_cxx11_,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  iVar1 = std::__cxx11::string::compare(player_name_abi_cxx11_);
  if (iVar1 == 0) {
    std::__cxx11::string::operator=((string *)player_name_abi_cxx11_,anon_var_dwarf_750b + 0x1c2);
  }
  pcVar5 = local_18[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,pcVar5,
             (allocator *)
             &server_address_1.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              .field_0x1f);
  anon_unknown.dwarf_7f68::split_hostname
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_98,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &server_address_1.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              .field_0x1f);
  p_Var3 = std::get<0ul,std::__cxx11::string,bool,std::__cxx11::string>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_98);
  std::__cxx11::string::operator=((string *)&servers[0].hostname,(string *)p_Var3);
  p_Var4 = std::get<1ul,std::__cxx11::string,bool,std::__cxx11::string>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_98);
  if ((*p_Var4 & 1U) != 0) {
    std::get<2ul,std::__cxx11::string,bool,std::__cxx11::string>
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98);
    pcVar5 = (char *)std::__cxx11::string::data();
    servers[0].port = anon_unknown.dwarf_7f68::parse<unsigned_short>(pcVar5,0,0xffff);
  }
  if (3 < (int)argv_local) {
    pcVar5 = local_18[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,pcVar5,(allocator *)((long)&__range1 + 7));
    anon_unknown.dwarf_7f68::split_hostname
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_108,(string *)local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    p_Var3 = std::get<0ul,std::__cxx11::string,bool,std::__cxx11::string>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_108);
    std::__cxx11::string::operator=((string *)&servers[1].hostname,(string *)p_Var3);
    p_Var4 = std::get<1ul,std::__cxx11::string,bool,std::__cxx11::string>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_108);
    if ((*p_Var4 & 1U) != 0) {
      std::get<2ul,std::__cxx11::string,bool,std::__cxx11::string>
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_108);
      pcVar5 = (char *)std::__cxx11::string::data();
      servers[1].port = anon_unknown.dwarf_7f68::parse<unsigned_short>(pcVar5,0,0xffff);
    }
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_108);
  }
  __end1 = servers;
  do {
    if (__end1 == (server_connection *)&active_player_names_abi_cxx11_) {
      recv_game._M_id._M_thread._4_4_ = 1;
      recv_game._M_id._M_thread._0_4_ =
           setsockopt(servers[1].socket,6,1,(void *)((long)&recv_game._M_id._M_thread + 4),4);
      if ((int)recv_game._M_id._M_thread < 0) {
        util::fatal("Couldn\'t turn off Nagle\'s algorithm");
      }
      std::thread::thread<void(&)(),,void>(&recv_gui,receive_game_job);
      std::thread::thread<void(&)(),,void>(&send_game,receive_gui_job);
      std::thread::thread<void(&)(),,void>(&send_gui,send_game_job);
      std::thread::thread<void(&)(),,void>(&local_1f0,send_gui_job);
      std::thread::join();
      std::thread::join();
      std::thread::join();
      std::thread::join();
      argv_local._4_4_ = 0;
      std::thread::~thread(&local_1f0);
      std::thread::~thread(&send_gui);
      std::thread::~thread(&send_game);
      std::thread::~thread(&recv_gui);
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98);
      return argv_local._4_4_;
    }
    std::__cxx11::to_string(local_170,(uint)__end1->port);
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_socktype = 0;
    hints.ai_protocol = 0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    res = (addrinfo *)0x0;
    hints.ai_family = 0;
    hints.ai_flags = __end1->desired_socktype;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    __service = (char *)std::__cxx11::string::c_str();
    iVar1 = getaddrinfo(pcVar5,__service,(addrinfo *)&res,&stack0xfffffffffffffe50);
    if (iVar1 != 0) {
      uVar6 = std::__cxx11::string::c_str();
      util::fatal("Couldn\'t resolve %s",uVar6);
    }
    for (sock = &paStack_1b0->ai_flags; sock != (int *)0x0; sock = *(int **)(sock + 10)) {
      iVar1 = socket(sock[1],sock[2],sock[3]);
      __end1->socket = iVar1;
      if (iVar1 == -1) {
        perror("socket");
      }
      else {
        iVar1 = connect(__end1->socket,*(sockaddr **)(sock + 6),sock[4]);
        if (iVar1 != -1) {
          memcpy(&__end1->addr,*(void **)(sock + 6),(ulong)(uint)sock[4]);
          __end1->addrlen = (ulong)(uint)sock[4];
          __end1->family = sock[1];
          __end1->protocol = sock[3];
          break;
        }
        perror("connect");
        close(__end1->socket);
      }
    }
    if (sock == (int *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      util::fatal("Couldn\'t establish a connection to %s:%hu",uVar6,(ulong)__end1->port);
    }
    freeaddrinfo(paStack_1b0);
    std::__cxx11::string::~string((string *)local_170);
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char* argv[])
{
	session_id = static_cast<std::uint64_t>(time(nullptr));

	if (argc < 3)
	{
		printf(usage_msg);
		std::exit(1);
	}

	if (strlen(argv[1]) > 64)
		util::fatal("Given player name (%s) is longer than 64 chars\n", argv[1]);

	player_name = std::string(argv[1]);
	if (player_name.compare("\"\"") == 0)
		player_name = "";

	// Split to get optional port, server host will be validated later with getaddrinfo()
	auto server_address = split_hostname(argv[2]);
	game_server.hostname = std::get<0>(server_address);
	if (std::get<1>(server_address))
	{
		game_server.port = parse<std::uint16_t>(std::get<2>(server_address).data(), 0, 65535);
	}
	// Ditto optionally for ui server hostname
	if (argc >= 4)
	{
		auto server_address = split_hostname(argv[3]);
		gui_server.hostname = std::get<0>(server_address);
		if (std::get<1>(server_address))
		{
			gui_server.port = parse<std::uint16_t>(std::get<2>(server_address).data(), 0, 65535);
		}
	}


#ifdef _WIN32
	WORD wVersionRequested;
	WSADATA wsaData;

	/* Use the MAKEWORD(lowbyte, highbyte) macro declared in Windef.h */
	wVersionRequested = MAKEWORD(2, 2);

	int err = WSAStartup(wVersionRequested, &wsaData);
	if (err != 0) {
		/* Tell the user that we could not find a usable */
		/* Winsock DLL.                                  */
		printf("WSAStartup failed with error: %d\n", err);
		return 1;
	}
#define close closesocket
#endif

	// Try to create sockets and connect via either IPv4 or IPv6 to game and ui server
	for (auto& server : servers)
	{
		const auto port = std::to_string(server.port);

		addrinfo hints, *res;
		memset(&hints, 0x00, sizeof(hints));
		hints.ai_socktype = server.desired_socktype;

		int error = getaddrinfo(server.hostname.c_str(), port.c_str(), &hints, &res);
		if (error != 0)
			util::fatal("Couldn't resolve %s", server.hostname.c_str());

		addrinfo* p;
		for (p = res; p != nullptr; p = p->ai_next)
		{
			auto& sock = server.socket;
			if ((sock = socket(p->ai_family, p->ai_socktype, p->ai_protocol)) == -1)
			{
				perror("socket");
				continue;
			}

			if (connect(sock, p->ai_addr, p->ai_addrlen) == -1)
			{
				perror("connect");
				close(sock);
				continue;
			}

			memcpy(&server.addr, p->ai_addr, p->ai_addrlen);
			server.addrlen = p->ai_addrlen;
			server.family = p->ai_family;
			server.protocol = p->ai_protocol;
			break;
		}

		if (p == nullptr)
			util::fatal("Couldn't establish a connection to %s:%hu", server.hostname.c_str(), server.port);

		freeaddrinfo(res);
	}

	// Turn off Nagle's algorithm for GUI TCP connection
	int off = 1;
	int result = setsockopt(gui_server.socket, IPPROTO_TCP, TCP_NODELAY, (const char*)&off, sizeof(off));
	if (result < 0)
		util::fatal("Couldn't turn off Nagle's algorithm");

	// TODO: Implement server<>client and client<>GUI communication
	std::thread recv_game(receive_game_job);
	std::thread recv_gui(receive_gui_job);
	std::thread send_game(send_game_job);
	std::thread send_gui(send_gui_job);

	recv_game.join();
	recv_gui.join();
	send_game.join();
	send_gui.join();

	return 0;
}